

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.h
# Opt level: O0

int quicly_decode_application_close_frame
              (uint8_t **src,uint8_t *end,quicly_application_close_frame_t *frame)

{
  uint64_t uVar1;
  undefined2 *in_RDX;
  uint8_t *in_RSI;
  uint8_t **in_RDI;
  ptls_iovec_t pVar2;
  uint64_t reason_len;
  uint64_t error_code;
  uint8_t *local_40;
  size_t local_38;
  
  uVar1 = ptls_decode_quicint(in_RDI,in_RSI);
  if (uVar1 != 0xffffffffffffffff) {
    *in_RDX = (short)uVar1;
    uVar1 = ptls_decode_quicint(in_RDI,in_RSI);
    if ((uVar1 != 0xffffffffffffffff) && (uVar1 <= (ulong)((long)in_RSI - (long)*in_RDI))) {
      pVar2 = ptls_iovec_init(*in_RDI,uVar1);
      local_40 = pVar2.base;
      *(uint8_t **)(in_RDX + 4) = local_40;
      local_38 = pVar2.len;
      *(size_t *)(in_RDX + 8) = local_38;
      *in_RDI = *in_RDI + uVar1;
      return 0;
    }
  }
  return 0x20007;
}

Assistant:

inline int quicly_decode_application_close_frame(const uint8_t **src, const uint8_t *end, quicly_application_close_frame_t *frame)
{
    uint64_t error_code, reason_len;

    if ((error_code = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    frame->error_code = (uint16_t)error_code;
    if ((reason_len = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if ((uint64_t)(end - *src) < reason_len)
        goto Error;
    frame->reason_phrase = ptls_iovec_init(*src, reason_len);
    *src += reason_len;
    return 0;
Error:
    return QUICLY_TRANSPORT_ERROR_FRAME_ENCODING;
}